

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

StringContainsMatcher *
Catch::Matchers::ContainsSubstring
          (StringContainsMatcher *__return_storage_ptr__,string *str,CaseSensitive caseSensitivity)

{
  undefined1 auStack_38 [40];
  
  CasedString::CasedString((CasedString *)auStack_38,str,caseSensitivity);
  StringContainsMatcher::StringContainsMatcher(__return_storage_ptr__,(CasedString *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  return __return_storage_ptr__;
}

Assistant:

StringContainsMatcher ContainsSubstring( std::string const& str, CaseSensitive caseSensitivity ) {
        return StringContainsMatcher( CasedString( str, caseSensitivity) );
    }